

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuD3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuD3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t cls;
  MthdEmuD3D56TlvFogCol1 *pMVar1;
  MthdEmuD3D56TlvColor *pMVar2;
  MthdEmuD3D56TlvW *pMVar3;
  MthdEmuD3D56TlvZ *pMVar4;
  MthdEmuD3D56TlvY *pMVar5;
  MthdEmuD3D56TlvX *pMVar6;
  MthdEmuD3D56FogColor *pMVar7;
  MthdEmuD3D6StencilOp *pMVar8;
  MthdEmuD3D6StencilFunc *pMVar9;
  MthdEmuD3D56Config *pMVar10;
  MthdEmuD3D56Blend *pMVar11;
  MthdEmuD3D6CombineFactor *pMVar12;
  MthdEmuD3D6CombineControl *pMVar13;
  MthdEmuD3D56TexFilter *pMVar14;
  MthdEmuD3D56TexFormat *pMVar15;
  MthdEmuD3D56TexOffset *pMVar16;
  MthdCtxSurf3D *pMVar17;
  MthdDmaGrobj *pMVar18;
  MthdDmaNotify *pMVar19;
  MthdPmTrigger *pMVar20;
  MthdNotify *pMVar21;
  SingleMthdTest *pSVar22;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar23;
  result_type rVar24;
  MthdEmuD3D56TlvUv *pMVar25;
  UntestedMthd *this_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_6ab;
  allocator local_6aa;
  allocator local_6a9;
  allocator local_6a8;
  allocator local_6a7;
  allocator local_6a6;
  allocator local_6a5;
  allocator local_6a4;
  allocator local_6a3;
  allocator local_6a2;
  allocator local_6a1;
  allocator local_6a0;
  allocator local_69f;
  allocator local_69e;
  allocator local_69d;
  allocator local_69c;
  allocator local_69b;
  allocator local_69a;
  allocator local_699;
  allocator local_698;
  allocator local_697;
  allocator local_696;
  allocator local_695;
  allocator local_694;
  allocator local_693;
  allocator local_692;
  allocator local_691;
  allocator local_690;
  allocator local_68f;
  allocator local_68e;
  allocator local_68d;
  allocator local_68c;
  allocator local_68b;
  allocator local_68a;
  allocator local_689;
  MthdEmuD3D56TlvUv *local_688;
  MthdEmuD3D56TlvUv *local_680;
  MthdEmuD3D56TlvFogCol1 *local_678;
  MthdEmuD3D56TlvColor *local_670;
  MthdEmuD3D56TlvW *local_668;
  MthdEmuD3D56TlvZ *local_660;
  MthdEmuD3D56TlvY *local_658;
  MthdEmuD3D56TlvX *local_650;
  MthdEmuD3D56FogColor *local_648;
  MthdEmuD3D6StencilOp *local_640;
  MthdEmuD3D6StencilFunc *local_638;
  MthdEmuD3D56Config *local_630;
  MthdEmuD3D56Blend *local_628;
  MthdEmuD3D6CombineFactor *local_620;
  MthdEmuD3D6CombineControl *local_618;
  MthdEmuD3D6CombineControl *local_610;
  MthdEmuD3D6CombineControl *local_608;
  MthdEmuD3D6CombineControl *local_600;
  MthdEmuD3D56TexFilter *local_5f8;
  MthdEmuD3D56TexFilter *local_5f0;
  MthdEmuD3D56TexFormat *local_5e8;
  MthdEmuD3D56TexFormat *local_5e0;
  MthdEmuD3D56TexOffset *local_5d8;
  MthdEmuD3D56TexOffset *local_5d0;
  MthdCtxSurf3D *local_5c8;
  MthdDmaGrobj *local_5c0;
  MthdDmaGrobj *local_5b8;
  MthdDmaNotify *local_5b0;
  MthdPmTrigger *local_5a8;
  MthdNotify *local_5a0;
  SingleMthdTest *local_598;
  MthdEmuD3D56TlvUv *local_590;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_588;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  SingleMthdTest *local_140;
  MthdNotify *local_138;
  MthdPmTrigger *local_130;
  MthdDmaNotify *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  MthdCtxSurf3D *local_110;
  MthdEmuD3D56TexOffset *local_108;
  MthdEmuD3D56TexOffset *local_100;
  MthdEmuD3D56TexFormat *local_f8;
  MthdEmuD3D56TexFormat *local_f0;
  MthdEmuD3D56TexFilter *local_e8;
  MthdEmuD3D56TexFilter *local_e0;
  MthdEmuD3D6CombineControl *local_d8;
  MthdEmuD3D6CombineControl *local_d0;
  MthdEmuD3D6CombineControl *local_c8;
  MthdEmuD3D6CombineControl *local_c0;
  MthdEmuD3D6CombineFactor *local_b8;
  MthdEmuD3D56Blend *local_b0;
  MthdEmuD3D56Config *local_a8;
  MthdEmuD3D6StencilFunc *local_a0;
  MthdEmuD3D6StencilOp *local_98;
  MthdEmuD3D56FogColor *local_90;
  MthdEmuD3D56TlvX *local_88;
  MthdEmuD3D56TlvY *local_80;
  MthdEmuD3D56TlvZ *local_78;
  MthdEmuD3D56TlvW *local_70;
  MthdEmuD3D56TlvColor *local_68;
  MthdEmuD3D56TlvFogCol1 *local_60;
  MthdEmuD3D56TlvUv *local_58;
  MthdEmuD3D56TlvUv *local_50;
  MthdEmuD3D56TlvUv *local_48;
  MthdEmuD3D56TlvUv *local_40;
  UntestedMthd *local_38;
  
  local_588 = __return_storage_ptr__;
  local_598 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_160,"nop",&local_689);
  pSVar22 = local_598;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_598,opt,(uint32_t)rVar24,&local_160,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_140 = pSVar22;
  local_5a0 = (MthdNotify *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_180,"notify",&local_68a);
  pMVar21 = local_5a0;
  MthdNotify::SingleMthdTest
            (local_5a0,opt,(uint32_t)rVar24,&local_180,0,(this->super_Class).cls,0x104,1,4);
  local_138 = pMVar21;
  local_5a8 = (MthdPmTrigger *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1a0,"pm_trigger",&local_68b);
  pMVar20 = local_5a8;
  MthdPmTrigger::SingleMthdTest
            (local_5a8,opt,(uint32_t)rVar24,&local_1a0,-1,(this->super_Class).cls,0x140,1,4);
  local_130 = pMVar20;
  local_5b0 = (MthdDmaNotify *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1c0,"dma_notify",&local_68c);
  pMVar19 = local_5b0;
  MthdDmaNotify::SingleMthdTest
            (local_5b0,opt,(uint32_t)rVar24,&local_1c0,1,(this->super_Class).cls,0x180,1,4);
  local_128 = pMVar19;
  local_5b8 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1e0,"dma_tex_a",&local_68d);
  pMVar18 = local_5b8;
  MthdDmaGrobj::MthdDmaGrobj
            (local_5b8,opt,(uint32_t)rVar24,&local_1e0,2,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar18;
  local_5c0 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_200,"dma_tex_b",&local_68e);
  pMVar18 = local_5c0;
  MthdDmaGrobj::MthdDmaGrobj
            (local_5c0,opt,(uint32_t)rVar24,&local_200,3,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar18;
  local_5c8 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_220,"ctx_surf3d",&local_68f);
  pMVar17 = local_5c8;
  cls = (this->super_Class).cls;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_5c8,opt,(uint32_t)rVar24,&local_220,4,cls,0x18c,(uint)(cls != 0x55));
  local_110 = pMVar17;
  local_5d0 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_240,"tex_0_offset",&local_690);
  pMVar16 = local_5d0;
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (local_5d0,opt,(uint32_t)rVar24,&local_240,5,(this->super_Class).cls,0x308,1);
  local_108 = pMVar16;
  local_5d8 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_260,"tex_1_offset",&local_691);
  pMVar16 = local_5d8;
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (local_5d8,opt,(uint32_t)rVar24,&local_260,6,(this->super_Class).cls,0x30c,2);
  local_100 = pMVar16;
  local_5e0 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_280,"tex_0_format",&local_692);
  pMVar15 = local_5e0;
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (local_5e0,opt,(uint32_t)rVar24,&local_280,7,(this->super_Class).cls,0x310,1);
  local_f8 = pMVar15;
  local_5e8 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2a0,"tex_1_format",&local_693);
  pMVar15 = local_5e8;
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (local_5e8,opt,(uint32_t)rVar24,&local_2a0,8,(this->super_Class).cls,0x314,2);
  local_f0 = pMVar15;
  local_5f0 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2c0,"tex_0_filter",&local_694);
  pMVar14 = local_5f0;
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (local_5f0,opt,(uint32_t)rVar24,&local_2c0,9,(this->super_Class).cls,0x318,1);
  local_e8 = pMVar14;
  local_5f8 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2e0,"tex_1_filter",&local_695);
  pMVar14 = local_5f8;
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (local_5f8,opt,(uint32_t)rVar24,&local_2e0,10,(this->super_Class).cls,0x31c,2);
  local_e0 = pMVar14;
  local_600 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_300,"combine_0_control_alpha",&local_696);
  pMVar13 = local_600;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_600,opt,(uint32_t)rVar24,&local_300,0xb,(this->super_Class).cls,800,0,0);
  local_d8 = pMVar13;
  local_608 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_320,"combine_0_control_color",&local_697);
  pMVar13 = local_608;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_608,opt,(uint32_t)rVar24,&local_320,0xc,(this->super_Class).cls,0x324,0,1);
  local_d0 = pMVar13;
  local_610 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_340,"combine_1_control_alpha",&local_698);
  pMVar13 = local_610;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_610,opt,(uint32_t)rVar24,&local_340,0xd,(this->super_Class).cls,0x32c,1,0);
  local_c8 = pMVar13;
  local_618 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_360,"combine_1_control_color",&local_699);
  pMVar13 = local_618;
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (local_618,opt,(uint32_t)rVar24,&local_360,0xe,(this->super_Class).cls,0x330,1,1);
  local_c0 = pMVar13;
  local_620 = (MthdEmuD3D6CombineFactor *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_380,"combine_factor",&local_69a);
  pMVar12 = local_620;
  MthdEmuD3D6CombineFactor::SingleMthdTest
            (local_620,opt,(uint32_t)rVar24,&local_380,0xf,(this->super_Class).cls,0x334,1,4);
  local_b8 = pMVar12;
  local_628 = (MthdEmuD3D56Blend *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3a0,"blend",&local_69b);
  pMVar11 = local_628;
  MthdEmuD3D56Blend::SingleMthdTest
            (local_628,opt,(uint32_t)rVar24,&local_3a0,0x10,(this->super_Class).cls,0x338,1,4);
  local_b0 = pMVar11;
  local_630 = (MthdEmuD3D56Config *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3c0,"config",&local_69c);
  pMVar10 = local_630;
  MthdEmuD3D56Config::SingleMthdTest
            (local_630,opt,(uint32_t)rVar24,&local_3c0,0x11,(this->super_Class).cls,0x33c,1,4);
  local_a8 = pMVar10;
  local_638 = (MthdEmuD3D6StencilFunc *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3e0,"stencil_func",&local_69d);
  pMVar9 = local_638;
  MthdEmuD3D6StencilFunc::SingleMthdTest
            (local_638,opt,(uint32_t)rVar24,&local_3e0,0x12,(this->super_Class).cls,0x340,1,4);
  local_a0 = pMVar9;
  local_640 = (MthdEmuD3D6StencilOp *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_400,"stencil_op",&local_69e);
  pMVar8 = local_640;
  MthdEmuD3D6StencilOp::SingleMthdTest
            (local_640,opt,(uint32_t)rVar24,&local_400,0x13,(this->super_Class).cls,0x344,1,4);
  local_98 = pMVar8;
  local_648 = (MthdEmuD3D56FogColor *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_420,"fog_color",&local_69f);
  pMVar7 = local_648;
  MthdEmuD3D56FogColor::SingleMthdTest
            (local_648,opt,(uint32_t)rVar24,&local_420,0x14,(this->super_Class).cls,0x348,1,4);
  local_90 = pMVar7;
  local_650 = (MthdEmuD3D56TlvX *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_440,"tlv_x",&local_6a0);
  pMVar6 = local_650;
  MthdEmuD3D56TlvX::SingleMthdTest
            (local_650,opt,(uint32_t)rVar24,&local_440,0x15,(this->super_Class).cls,0x400,8,0x28);
  local_88 = pMVar6;
  local_658 = (MthdEmuD3D56TlvY *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_460,"tlv_y",&local_6a1);
  pMVar5 = local_658;
  MthdEmuD3D56TlvY::SingleMthdTest
            (local_658,opt,(uint32_t)rVar24,&local_460,0x16,(this->super_Class).cls,0x404,8,0x28);
  local_80 = pMVar5;
  local_660 = (MthdEmuD3D56TlvZ *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_480,"tlv_z",&local_6a2);
  pMVar4 = local_660;
  MthdEmuD3D56TlvZ::SingleMthdTest
            (local_660,opt,(uint32_t)rVar24,&local_480,0x17,(this->super_Class).cls,0x408,8,0x28);
  local_78 = pMVar4;
  local_668 = (MthdEmuD3D56TlvW *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4a0,"tlv_rhw",&local_6a3);
  pMVar3 = local_668;
  MthdEmuD3D56TlvW::SingleMthdTest
            (local_668,opt,(uint32_t)rVar24,&local_4a0,0x18,(this->super_Class).cls,0x40c,8,0x28);
  local_70 = pMVar3;
  local_670 = (MthdEmuD3D56TlvColor *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4c0,"tlv_color",&local_6a4);
  pMVar2 = local_670;
  MthdEmuD3D56TlvColor::SingleMthdTest
            (local_670,opt,(uint32_t)rVar24,&local_4c0,0x19,(this->super_Class).cls,0x410,8,0x28);
  local_68 = pMVar2;
  local_678 = (MthdEmuD3D56TlvFogCol1 *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4e0,"tlv_fog_col1",&local_6a5);
  pMVar1 = local_678;
  MthdEmuD3D56TlvFogCol1::SingleMthdTest
            (local_678,opt,(uint32_t)rVar24,&local_4e0,0x1a,(this->super_Class).cls,0x414,8,0x28);
  local_60 = pMVar1;
  local_680 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_500,"tlv_u_0",&local_6a6);
  pMVar25 = local_680;
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (local_680,opt,(uint32_t)rVar24,&local_500,0x1b,(this->super_Class).cls,0x418,8,0x28,0,0
             ,false);
  local_58 = pMVar25;
  local_688 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_520,"tlv_v_0",&local_6a7);
  pMVar25 = local_688;
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (local_688,opt,(uint32_t)rVar24,&local_520,0x1c,(this->super_Class).cls,0x41c,8,0x28,0,1
             ,false);
  local_50 = pMVar25;
  pMVar25 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_590 = pMVar25;
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_540,"tlv_u_1",&local_6a8);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar25,opt,(uint32_t)rVar24,&local_540,0x1d,(this->super_Class).cls,0x420,8,0x28,1,0,
             false);
  local_48 = pMVar25;
  pMVar25 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_560,"tlv_v_1",&local_6a9);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar25,opt,(uint32_t)rVar24,&local_560,0x1e,(this->super_Class).cls,0x424,8,0x28,1,1,
             true);
  local_40 = pMVar25;
  this_01 = (UntestedMthd *)operator_new(0x25950);
  rVar24 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_580,"draw",&local_6aa);
  UntestedMthd::SingleMthdTest
            (this_01,opt,(uint32_t)rVar24,&local_580,0x1f,(this->super_Class).cls,0x540,0x30,4);
  pvVar23 = local_588;
  __l._M_len = 0x22;
  __l._M_array = &local_140;
  local_38 = this_01;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_588,__l,&local_6ab);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  return pvVar23;
}

Assistant:

std::vector<SingleMthdTest *> EmuD3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", 3, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", 4, cls, 0x18c, cls == 0x55 ? SURF2D_NV4 : SURF2D_NV10),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_0_offset", 5, cls, 0x308, 1),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_1_offset", 6, cls, 0x30c, 2),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_0_format", 7, cls, 0x310, 1),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_1_format", 8, cls, 0x314, 2),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_0_filter", 9, cls, 0x318, 1),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_1_filter", 10, cls, 0x31c, 2),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", 11, cls, 0x320, 0, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_color", 12, cls, 0x324, 0, 1),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", 13, cls, 0x32c, 1, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_color", 14, cls, 0x330, 1, 1),
		new MthdEmuD3D6CombineFactor(opt, rnd(), "combine_factor", 15, cls, 0x334),
		new MthdEmuD3D56Blend(opt, rnd(), "blend", 16, cls, 0x338),
		new MthdEmuD3D56Config(opt, rnd(), "config", 17, cls, 0x33c),
		new MthdEmuD3D6StencilFunc(opt, rnd(), "stencil_func", 18, cls, 0x340),
		new MthdEmuD3D6StencilOp(opt, rnd(), "stencil_op", 19, cls, 0x344),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 20, cls, 0x348),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 21, cls, 0x400, 8, 0x28),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 22, cls, 0x404, 8, 0x28),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 23, cls, 0x408, 8, 0x28),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 24, cls, 0x40c, 8, 0x28),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 25, cls, 0x410, 8, 0x28),
		new MthdEmuD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", 26, cls, 0x414, 8, 0x28),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_0", 27, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_0", 28, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_1", 29, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_1", 30, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", 31, cls, 0x540, 0x30),
	};
}